

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_bnot(lua_State *L,TValue *ra,TValue *rb)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ushort uVar4;
  TValue *io;
  TValue *pTVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  uVar4 = 1;
  pTVar5 = ra;
  if (rb->tt_ == 3) {
    dVar1 = (rb->value_).n;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    auVar7 = vroundsd_avx(auVar7,auVar7,9);
    dVar6 = auVar7._0_8_;
    if ((dVar6 == dVar1) && (!NAN(dVar6) && !NAN(dVar1))) {
      uVar2 = vcmppd_avx512vl(auVar7,ZEXT816(0x43e0000000000000),5);
      uVar3 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar7,6);
      uVar4 = (ushort)uVar3 & 3 | (ushort)uVar2 & 3;
      pTVar5 = (TValue *)(long)dVar6;
    }
  }
  else if (rb->tt_ == 0x13) {
    pTVar5 = (TValue *)(rb->value_).i;
    goto LAB_00134254;
  }
  if ((uVar4 & 1) != 0) {
    luaT_trybinTM(L,rb,rb,ra,TM_BNOT);
    return;
  }
LAB_00134254:
  (ra->value_).i = ~(ulong)pTVar5;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_bnot(lua_State *L, TValue *ra, TValue *rb) {
  lua_Integer ib;
  if (tointegerns(rb, &ib)) { setivalue(ra, intop (^, ~l_castS2U(0), ib)); }
  else {
    luaT_trybinTM(L, rb, rb, ra, TM_BNOT);
  }
}